

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::gather_grid(RTCGeometry geom,avector<Vec3fa> *positions,size_t width,size_t height,
                        uint *indices,avector<Vec3fa> *vertices,uint edgey)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  ulong in_RCX;
  undefined4 *puVar7;
  undefined8 *puVar8;
  ulong in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_R8;
  long in_R9;
  size_t x_1;
  uint in_stack_00000008;
  uint edgex;
  size_t x;
  uint edgex_1;
  size_t y;
  ulong local_118;
  uint local_10c;
  ulong local_108;
  uint local_fc;
  ulong local_f8;
  
  for (local_f8 = 0; local_f8 < in_RCX; local_f8 = local_f8 + 1) {
    local_fc = in_stack_00000008;
    for (local_108 = 0; local_108 < in_RDX; local_108 = local_108 + 1) {
      puVar5 = (undefined4 *)
               (*(long *)(in_R9 + 0x18) + (ulong)*(uint *)(in_R8 + (ulong)local_fc * 4) * 0x10);
      puVar7 = (undefined4 *)
               (*(long *)(in_RSI + 0x18) + (local_f8 * (in_RDX + 1) + local_108) * 0x10);
      uVar4 = puVar5[1];
      uVar1 = puVar5[2];
      uVar2 = puVar5[3];
      *puVar7 = *puVar5;
      puVar7[1] = uVar4;
      puVar7[2] = uVar1;
      puVar7[3] = uVar2;
      local_fc = rtcGetGeometryPreviousHalfEdge(in_RDI,local_fc);
      if (local_108 + 1 < in_RDX) {
        uVar4 = rtcGetGeometryPreviousHalfEdge(in_RDI,local_fc);
        local_fc = rtcGetGeometryOppositeHalfEdge(in_RDI,0,uVar4);
      }
    }
    puVar5 = (undefined4 *)
             (*(long *)(in_R9 + 0x18) + (ulong)*(uint *)(in_R8 + (ulong)local_fc * 4) * 0x10);
    puVar7 = (undefined4 *)(*(long *)(in_RSI + 0x18) + (local_f8 * (in_RDX + 1) + local_108) * 0x10)
    ;
    uVar4 = puVar5[1];
    uVar1 = puVar5[2];
    uVar2 = puVar5[3];
    *puVar7 = *puVar5;
    puVar7[1] = uVar4;
    puVar7[2] = uVar1;
    puVar7[3] = uVar2;
    in_stack_00000008 = rtcGetGeometryNextHalfEdge(in_RDI,in_stack_00000008);
    if (local_f8 + 1 < in_RCX) {
      in_stack_00000008 = rtcGetGeometryOppositeHalfEdge(in_RDI,0,in_stack_00000008);
      in_stack_00000008 = rtcGetGeometryNextHalfEdge(in_RDI,in_stack_00000008);
    }
  }
  local_10c = in_stack_00000008;
  for (local_118 = 0; local_118 < in_RDX; local_118 = local_118 + 1) {
    puVar5 = (undefined4 *)
             (*(long *)(in_R9 + 0x18) + (ulong)*(uint *)(in_R8 + (ulong)local_10c * 4) * 0x10);
    puVar7 = (undefined4 *)(*(long *)(in_RSI + 0x18) + (local_f8 * (in_RDX + 1) + local_118) * 0x10)
    ;
    uVar4 = puVar5[1];
    uVar1 = puVar5[2];
    uVar2 = puVar5[3];
    *puVar7 = *puVar5;
    puVar7[1] = uVar4;
    puVar7[2] = uVar1;
    puVar7[3] = uVar2;
    local_10c = rtcGetGeometryNextHalfEdge(in_RDI,local_10c);
    if (local_118 + 1 < in_RDX) {
      uVar4 = rtcGetGeometryOppositeHalfEdge(in_RDI,0,local_10c);
      local_10c = rtcGetGeometryNextHalfEdge(in_RDI,uVar4);
    }
  }
  puVar6 = (undefined8 *)
           (*(long *)(in_R9 + 0x18) + (ulong)*(uint *)(in_R8 + (ulong)local_10c * 4) * 0x10);
  puVar8 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (in_RCX * (in_RDX + 1) + in_RDX) * 0x10);
  uVar3 = puVar6[1];
  *puVar8 = *puVar6;
  puVar8[1] = uVar3;
  return;
}

Assistant:

void gather_grid(RTCGeometry geom, avector<Vec3fa>& positions, size_t width, size_t height, unsigned int* indices, avector<Vec3fa>& vertices, unsigned int edgey)
  {
    //        
    // | <----------    <----------
    // |            /\ |           /\ .
    // | edgey       | |           |
    // |             | |           |
    // \/            | \/          |
    
    /* gather all rows */
    size_t y=0;
    for (; y<height; y++)
    {
      /* here edgey points from top/left vertex downwards */
      unsigned int edgex = edgey;

      /* gather all columns */
      size_t x=0;
      for (; x<width; x++)
      {
        /* here edgex points from left vertex of row downwards */
        positions[y*(width+1)+x] = vertices[indices[edgex]];

        /* prev -> prev -> opposite moves to the next column (unless we reach the right end) */
        edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
        if (x+1 < width) {
          edgex = rtcGetGeometryPreviousHalfEdge(geom,edgex);
          edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        }
      }
      /* load rightmost vertex */
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to next row (unless we reach the bottom) */
      edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      if (y+1 < height) {
        edgey = rtcGetGeometryOppositeHalfEdge(geom,0,edgey);
        edgey = rtcGetGeometryNextHalfEdge(geom,edgey);
      }
    }

    /* special treatment for last row, edgy points from the bottom/left vertex to the right */
    unsigned int edgex = edgey;
    for (size_t x=0; x<width; x++)
    {
      positions[y*(width+1)+x] = vertices[indices[edgex]];

      /* next -> opposite -> next moves to the next column (unless we reach the right end) */
      edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      if (x+1 < width) {
        edgex = rtcGetGeometryOppositeHalfEdge(geom,0,edgex);
        edgex = rtcGetGeometryNextHalfEdge(geom,edgex);
      }
    }
    /* load rightmost vertex */
    positions[height*(width+1)+width] = vertices[indices[edgex]];
  }